

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pjpeg.c
# Opt level: O0

void pjpeg_destroy(pjpeg_t *pj)

{
  int local_14;
  int i;
  pjpeg_t *pj_local;
  
  if (pj != (pjpeg_t *)0x0) {
    for (local_14 = 0; local_14 < pj->ncomponents; local_14 = local_14 + 1) {
      free(pj->components[local_14].data);
    }
    free(pj->components);
    free(pj);
  }
  return;
}

Assistant:

void pjpeg_destroy(pjpeg_t *pj)
{
    if (!pj)
        return;

    for (int i = 0; i < pj->ncomponents; i++)
        free(pj->components[i].data);
    free(pj->components);

    free(pj);
}